

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

int mraa_aio_read(mraa_aio_context dev)

{
  mraa_result_t mVar1;
  ssize_t sVar2;
  int *piVar3;
  ulong uVar4;
  uint local_44;
  char **ppcStack_40;
  uint analog_value;
  char *end;
  char buffer [17];
  mraa_aio_context dev_local;
  
  if (dev == (mraa_aio_context)0x0) {
    syslog(3,"aio: read: context is invalid");
    dev_local._4_4_ = 0xffffffff;
  }
  else if (((dev == (mraa_aio_context)0x0) || (dev->advance_func == (mraa_adv_func_t *)0x0)) ||
          (dev->advance_func->aio_read_replace == (_func_int_mraa_aio_context *)0x0)) {
    if ((dev->adc_in_fp == -1) && (mVar1 = aio_get_valid_fp(dev), mVar1 != MRAA_SUCCESS)) {
      syslog(3,"aio: Failed to get to the device");
      dev_local._4_4_ = 0xffffffff;
    }
    else {
      lseek(dev->adc_in_fp,0,0);
      sVar2 = read(dev->adc_in_fp,&end,0x11);
      if (sVar2 < 1) {
        syslog(3,"aio: Failed to read a sensible value");
      }
      buffer[8] = '\0';
      lseek(dev->adc_in_fp,0,0);
      piVar3 = __errno_location();
      *piVar3 = 0;
      uVar4 = strtoul((char *)&end,(char **)&stack0xffffffffffffffc0,10);
      if (ppcStack_40 == &end) {
        syslog(3,"aio: Value is not a decimal number");
        dev_local._4_4_ = 0xffffffff;
      }
      else {
        piVar3 = __errno_location();
        if (*piVar3 == 0) {
          if (raw_bits < dev->value_bit) {
            local_44 = (uint)uVar4 << ((byte)shifter_value & 0x1f);
          }
          else {
            local_44 = (uint)uVar4 >> ((byte)shifter_value & 0x1f);
          }
          dev_local._4_4_ = local_44;
        }
        else {
          syslog(3,"aio: Errno was set");
          dev_local._4_4_ = 0xffffffff;
        }
      }
    }
  }
  else {
    dev_local._4_4_ = (*dev->advance_func->aio_read_replace)(dev);
  }
  return dev_local._4_4_;
}

Assistant:

int
mraa_aio_read(mraa_aio_context dev)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "aio: read: context is invalid");
        return -1;
    }

    if (IS_FUNC_DEFINED(dev, aio_read_replace)) {
        return dev->advance_func->aio_read_replace(dev);
    }

    char buffer[17];
    if (dev->adc_in_fp == -1) {
        if (aio_get_valid_fp(dev) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "aio: Failed to get to the device");
            return -1;
        }
    }

    lseek(dev->adc_in_fp, 0, SEEK_SET);
    if (read(dev->adc_in_fp, buffer, sizeof(buffer)) < 1) {
        syslog(LOG_ERR, "aio: Failed to read a sensible value");
    }
    // force NULL termination of string
    buffer[16] = '\0';
    lseek(dev->adc_in_fp, 0, SEEK_SET);

    errno = 0;
    char* end;
    unsigned int analog_value = (unsigned int) strtoul(buffer, &end, 10);
    if (end == &buffer[0]) {
        syslog(LOG_ERR, "aio: Value is not a decimal number");
        return -1;
    } else if (errno != 0) {
        syslog(LOG_ERR, "aio: Errno was set");
        return -1;
    }

    /* Adjust the raw analog input reading to supported resolution value*/
    if (raw_bits < dev->value_bit) {
        analog_value = analog_value << shifter_value;
    } else {
        analog_value = analog_value >> shifter_value;
    }

    return analog_value;
}